

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unicorn64.c
# Opt level: O0

uc_err reg_write_sparc64(void *_env,int mode,uint regid,void *value,size_t *size,int *setpc)

{
  uc_err local_44;
  uc_err ret;
  CPUSPARCState_conflict1 *env;
  int *setpc_local;
  size_t *size_local;
  void *value_local;
  uint regid_local;
  int mode_local;
  void *_env_local;
  
  local_44 = UC_ERR_ARG;
  if ((regid < 0x35) || (0x3c < regid)) {
    if ((regid < 0x4e) || (0x55 < regid)) {
      if ((regid < 0x46) || (0x4d < regid)) {
        if ((regid < 0x3d) || (0x44 < regid)) {
          if (regid == 0x58) {
            if (*size < 8) {
              return UC_ERR_OVERFLOW;
            }
            *size = 8;
            local_44 = UC_ERR_OK;
            *(undefined8 *)((long)_env + 0x48) = *value;
            *(long *)((long)_env + 0x50) = *value + 4;
            *setpc = 1;
          }
        }
        else {
          if (*size < 8) {
            return UC_ERR_OVERFLOW;
          }
          *size = 8;
          local_44 = UC_ERR_OK;
          *(undefined8 *)(*(long *)((long)_env + 0x40) + (ulong)(regid - 0x2d) * 8) = *value;
        }
      }
      else {
        if (*size < 8) {
          return UC_ERR_OVERFLOW;
        }
        *size = 8;
        local_44 = UC_ERR_OK;
        *(undefined8 *)(*(long *)((long)_env + 0x40) + (ulong)(regid - 0x3e) * 8) = *value;
      }
    }
    else {
      if (*size < 8) {
        return UC_ERR_OVERFLOW;
      }
      *size = 8;
      local_44 = UC_ERR_OK;
      *(undefined8 *)(*(long *)((long)_env + 0x40) + (ulong)(regid - 0x4e) * 8) = *value;
    }
  }
  else {
    if (*size < 8) {
      return UC_ERR_OVERFLOW;
    }
    *size = 8;
    local_44 = UC_ERR_OK;
    *(undefined8 *)((long)_env + (ulong)(regid - 0x35) * 8) = *value;
  }
  return local_44;
}

Assistant:

DEFAULT_VISIBILITY
uc_err reg_write(void *_env, int mode, unsigned int regid, const void *value,
                        size_t *size, int *setpc)
{
    CPUSPARCState *env = _env;
    uc_err ret = UC_ERR_ARG;

    if (regid >= UC_SPARC_REG_G0 && regid <= UC_SPARC_REG_G7) {
        CHECK_REG_TYPE(uint64_t);
        env->gregs[regid - UC_SPARC_REG_G0] = *(uint64_t *)value;
    } else if (regid >= UC_SPARC_REG_O0 && regid <= UC_SPARC_REG_O7) {
        CHECK_REG_TYPE(uint64_t);
        env->regwptr[regid - UC_SPARC_REG_O0] = *(uint64_t *)value;
    } else if (regid >= UC_SPARC_REG_L0 && regid <= UC_SPARC_REG_L7) {
        CHECK_REG_TYPE(uint64_t);
        env->regwptr[8 + regid - UC_SPARC_REG_L0] = *(uint64_t *)value;
    } else if (regid >= UC_SPARC_REG_I0 && regid <= UC_SPARC_REG_I7) {
        CHECK_REG_TYPE(uint64_t);
        env->regwptr[16 + regid - UC_SPARC_REG_I0] = *(uint64_t *)value;
    } else {
        switch(regid) {
        default:
            break;
        case UC_SPARC_REG_PC:
            CHECK_REG_TYPE(uint64_t);
            env->pc = *(uint64_t *)value;
            env->npc = *(uint64_t *)value + 4;
            *setpc = 1;
            break;
        }
    }

    return ret;
}